

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.cpp
# Opt level: O1

void __thiscall
PartialJointPolicyPureVector::PartialJointPolicyPureVector
          (PartialJointPolicyPureVector *this,Interface_ProblemToPolicyDiscretePure *pu,
          PolicyDomainCategory idc,double pastReward,size_t depth)

{
  JointPolicyDiscretePure::JointPolicyDiscretePure((JointPolicyDiscretePure *)this,pu,idc);
  (this->super_PartialJointPolicyDiscretePure).super_PartialJointPolicy._m_pastReward = pastReward;
  (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
  super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005aef08;
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            (&this->super_JPolComponent_VectorImplementation,pu,idc,depth);
  (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
  super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005af018;
  (this->super_JPolComponent_VectorImplementation)._vptr_JPolComponent_VectorImplementation =
       (_func_int **)&DAT_005af0f8;
  (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
  super_JointPolicyDiscrete.super_JointPolicy._m_depth = depth;
  JPolComponent_VectorImplementation::SetDepthForIndivPols
            (&this->super_JPolComponent_VectorImplementation,depth);
  return;
}

Assistant:

PartialJointPolicyPureVector::PartialJointPolicyPureVector(
    const Interface_ProblemToPolicyDiscretePure* pu,
    PolicyGlobals::PolicyDomainCategory idc,
    double pastReward,
    size_t depth) :
    PartialJointPolicyDiscretePure(pu, idc, pastReward),
    JPolComponent_VectorImplementation(pu, idc, depth)
{
    SetDepth(depth);
}